

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TargetImageWidget.cpp
# Opt level: O3

void __thiscall TargetImageWidget::paintEvent(TargetImageWidget *this,QPaintEvent *param_1)

{
  undefined8 uVar1;
  undefined8 uVar2;
  long lVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  QPainter p;
  QPen targetAreaPen;
  undefined1 auStack_48 [16];
  undefined1 local_38 [16];
  double local_28;
  double local_20;
  
  QPainter::QPainter((QPainter *)auStack_48,
                     (QPaintDevice *)&(this->super_PanAndZoomWidget).field_0x10);
  QBrush::QBrush((QBrush *)local_38,white,SolidPattern);
  QPainter::setBackground((QBrush *)auStack_48);
  QBrush::~QBrush((QBrush *)local_38);
  PaintImage(this,(QPainter *)auStack_48);
  QPainter::setCompositionMode((CompositionMode)auStack_48);
  QColor::QColor((QColor *)local_38,white);
  QPen::QPen((QPen *)(auStack_48 + 8),(QColor *)local_38);
  QPen::setWidthF(5.0);
  QPen::setStyle((int)auStack_48 + 8);
  QPainter::setPen((QPen *)auStack_48);
  lVar3 = *(long *)&(this->super_PanAndZoomWidget).field_0x20;
  uVar1 = *(undefined8 *)(lVar3 + 0x1c);
  uVar2 = *(undefined8 *)(lVar3 + 0x14);
  iVar5 = ((int)uVar1 - (int)uVar2) + 1;
  iVar6 = ((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1;
  iVar4 = iVar5;
  if (iVar6 < iVar5) {
    iVar4 = iVar6;
  }
  local_28 = (double)iVar4;
  local_38._0_8_ = ((double)iVar5 - local_28) * 0.5;
  local_38._8_8_ = ((double)iVar6 - local_28) * 0.5;
  local_20 = local_28;
  QPainter::drawRects((QRectF *)auStack_48,(int)local_38);
  QPen::~QPen((QPen *)(auStack_48 + 8));
  QPainter::~QPainter((QPainter *)auStack_48);
  return;
}

Assistant:

void TargetImageWidget::paintEvent(QPaintEvent* /*event*/)
{
    QPainter p(this);
    p.setBackground(QBrush(Qt::white));

    PaintImage(p);

    // Draw bounds that need filling
    p.setCompositionMode(QPainter::CompositionMode_Difference);

    QPen targetAreaPen(Qt::white);
    targetAreaPen.setWidthF(qreal{ 5.0 });
    targetAreaPen.setStyle(Qt::PenStyle::DashLine);
    p.setPen(targetAreaPen);

    p.drawRect(GetTargetRect());
}